

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDHPublicKey.cpp
# Opt level: O2

void __thiscall OSSLDHPublicKey::~OSSLDHPublicKey(OSSLDHPublicKey *this)

{
  *(undefined ***)&this->super_DHPublicKey = &PTR_serialise_0014d858;
  DH_free((DH *)this->dh);
  DHPublicKey::~DHPublicKey(&this->super_DHPublicKey);
  return;
}

Assistant:

OSSLDHPublicKey::~OSSLDHPublicKey()
{
	DH_free(dh);
}